

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_sk_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,uint8_t *flags,char **application,
              uchar **key_handle,size_t *handle_len,EVP_PKEY **ec_ctx)

{
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  size_t sVar4;
  size_t app_len;
  EVP_PKEY *ec_key;
  uchar *p;
  uchar *app;
  uchar *point_buf;
  size_t pointlen;
  size_t curvelen;
  uchar *curve;
  
  ec_key = (EVP_PKEY *)0x0;
  iVar1 = _libssh2_get_string(decrypted,&curve,&curvelen);
  if ((iVar1 != 0) || (curvelen == 0)) {
    pcVar3 = "ECDSA no curve";
LAB_001187d4:
    _libssh2_error(session,-0xe,pcVar3);
    return -1;
  }
  iVar1 = _libssh2_get_string(decrypted,&point_buf,&pointlen);
  if (iVar1 != 0) {
    pcVar3 = "ECDSA no point";
    goto LAB_001187d4;
  }
  iVar1 = _libssh2_ecdsa_curve_name_with_octal_new
                    (&ec_key,point_buf,pointlen,LIBSSH2_EC_CURVE_NISTP256);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_string(decrypted,&app,&app_len);
    if (iVar1 == 0) {
      if ((flags == (uint8_t *)0x0) || (iVar1 = _libssh2_get_byte(decrypted,flags), iVar1 == 0)) {
        if (handle_len != (size_t *)0x0 && key_handle != (uchar **)0x0) {
          p = (uchar *)0x0;
          iVar1 = _libssh2_get_string(decrypted,&p,handle_len);
          if (iVar1 != 0) {
            pcVar3 = "No SK key_handle.";
            goto LAB_00118844;
          }
          if (*handle_len != 0) {
            puVar2 = (uchar *)(*session->alloc)(*handle_len,&session->abstract);
            *key_handle = puVar2;
            if (puVar2 != (uchar *)0x0) {
              memcpy(puVar2,p,*handle_len);
            }
          }
        }
        iVar1 = 0;
        if (((pubkeydata != (uchar **)0x0) && (method != (uchar **)0x0)) &&
           (ec_key != (EVP_PKEY *)0x0)) {
          iVar1 = gen_publickey_from_ec_evp
                            (session,method,method_len,pubkeydata,pubkeydata_len,1,ec_key);
        }
        if (iVar1 != 0 || pubkeydata == (uchar **)0x0) {
LAB_00118a4d:
          if (ec_ctx != (EVP_PKEY **)0x0) {
            *ec_ctx = ec_key;
            return iVar1;
          }
          EVP_PKEY_free((EVP_PKEY *)ec_key);
          return iVar1;
        }
        sVar4 = *pubkeydata_len + app_len + 4;
        puVar2 = (uchar *)(*session->alloc)(sVar4,&session->abstract);
        if (puVar2 != (uchar *)0x0) {
          p = puVar2 + *pubkeydata_len;
          memcpy(puVar2,*pubkeydata,*pubkeydata_len);
          _libssh2_store_str(&p,(char *)app,app_len);
          if (app_len != 0 && application != (char **)0x0) {
            pcVar3 = (char *)(*session->alloc)(app_len + 1,&session->abstract);
            *application = pcVar3;
            explicit_bzero(pcVar3,app_len + 1);
            memcpy(*application,app,app_len);
          }
          (*session->free)(*pubkeydata,&session->abstract);
          *pubkeydata_len = sVar4;
          *pubkeydata = puVar2;
          goto LAB_00118a4d;
        }
        goto LAB_00118822;
      }
      pcVar3 = "No SK flags.";
    }
    else {
      pcVar3 = "No SK application.";
    }
LAB_00118844:
    _libssh2_error(session,-0xe,pcVar3);
    iVar1 = 0;
  }
  else {
    _libssh2_error(session,-0xe,"ECDSA could not create key");
LAB_00118822:
    iVar1 = -1;
  }
  if (ec_key != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)ec_key);
  }
  if ((application != (char **)0x0) && (*application != (char *)0x0)) {
    (*session->free)(application,&session->abstract);
    *application = (char *)0x0;
  }
  if (key_handle == (uchar **)0x0) {
    return iVar1;
  }
  if (*key_handle == (uchar *)0x0) {
    return iVar1;
  }
  (*session->free)(key_handle,&session->abstract);
  *key_handle = (uchar *)0x0;
  return iVar1;
}

Assistant:

static int
gen_publickey_from_sk_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                              struct string_buf *decrypted,
                                              unsigned char **method,
                                              size_t *method_len,
                                              unsigned char **pubkeydata,
                                              size_t *pubkeydata_len,
                                              uint8_t *flags,
                                              const char **application,
                                              const unsigned char **key_handle,
                                              size_t *handle_len,
                                              libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, pointlen, key_len, app_len;
    unsigned char *curve, *point_buf, *p, *key, *app;
    libssh2_ecdsa_ctx *ec_key = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Extracting ECDSA-SK public key"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  LIBSSH2_EC_CURVE_NISTP256);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    if(_libssh2_get_string(decrypted, &app, &app_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK application.");
        goto fail;
    }

    if(flags && _libssh2_get_byte(decrypted, flags)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK flags.");
        goto fail;
    }

    if(key_handle && handle_len) {
        unsigned char *handle = NULL;
        if(_libssh2_get_string(decrypted, &handle, handle_len)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "No SK key_handle.");
            goto fail;
        }

        if(*handle_len > 0) {
            *key_handle = LIBSSH2_ALLOC(session, *handle_len);

            if(*key_handle) {
                memcpy((void *)LIBSSH2_UNCONST(*key_handle),
                       handle, *handle_len);
            }
        }
    }

    if(rc == 0 && ec_key && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = ec_key;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);
#endif

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       1, pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(rc == 0 && pubkeydata) {
        key_len = *pubkeydata_len + app_len + 4;
        key = LIBSSH2_ALLOC(session, key_len);

        if(!key) {
            rc = -1;
            goto fail;
        }

        p = key + *pubkeydata_len;

        memcpy(key, *pubkeydata, *pubkeydata_len);
        _libssh2_store_str(&p, (const char *)app, app_len);

        if(application && app_len > 0) {
            *application = LIBSSH2_ALLOC(session, app_len + 1);
            _libssh2_explicit_zero((void *)LIBSSH2_UNCONST(*application),
                                   app_len + 1);
            memcpy((void *)LIBSSH2_UNCONST(*application), app, app_len);
        }

        LIBSSH2_FREE(session, *pubkeydata);
        *pubkeydata_len = key_len;

        if(pubkeydata)
            *pubkeydata = key;
        else if(key)
            LIBSSH2_FREE(session, key);
    }

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        _libssh2_ecdsa_free(ec_key);

    return rc;

fail:
    if(ec_key)
        _libssh2_ecdsa_free(ec_key);

    if(application && *application) {
        LIBSSH2_FREE(session, (void *)application);
        *application = NULL;
    }

    if(key_handle && *key_handle) {
        LIBSSH2_FREE(session, (void *)key_handle);
        *key_handle = NULL;
    }

    return rc;
}